

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::Typeof(Var var,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptString *pJVar8;
  undefined4 extraout_var;
  
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00995a1d;
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(var);
  if ((ulong)var >> 0x32 == 0 && !bVar3) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(var);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00995a1d;
      *puVar6 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar4 = RecyclableObject::IsExternal(pRVar7);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00995a1d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
    if (3 < TVar1 - TypeIds_FirstNumberType) {
      if (TVar1 == TypeIds_Null) {
        pJVar8 = StringCache::GetObjectTypeDisplay
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             stringCache);
        return pJVar8;
      }
      if (TVar1 != TypeIds_Undefined) {
        pRVar7 = VarTo<Js::RecyclableObject>(var);
        if ((((pRVar7->type).ptr)->flags & TypeFlagMask_IsFalsy) == TypeFlagMask_None) {
          pRVar7 = VarTo<Js::RecyclableObject>(var);
          iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x53])(pRVar7,scriptContext);
          return (Var)CONCAT44(extraout_var,iVar5);
        }
      }
      pJVar8 = StringCache::GetUndefinedDisplay
                         (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache
                         );
      return pJVar8;
    }
  }
  pJVar8 = StringCache::GetNumberTypeDisplay
                     (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  return pJVar8;
}

Assistant:

Var JavascriptOperators::Typeof(Var var, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_Typeof);
        switch (JavascriptOperators::GetTypeId(var))
        {
        case TypeIds_Undefined:
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        case TypeIds_Null:
            //null
            return scriptContext->GetLibrary()->GetObjectTypeDisplayString();
        case TypeIds_Integer:
        case TypeIds_Number:
        case TypeIds_Int64Number:
        case TypeIds_UInt64Number:
            return scriptContext->GetLibrary()->GetNumberTypeDisplayString();
        default:
            // Falsy objects are typeof 'undefined'.
            if (VarTo<RecyclableObject>(var)->GetType()->IsFalsy())
            {
                return scriptContext->GetLibrary()->GetUndefinedDisplayString();
            }
            else
            {
                return VarTo<RecyclableObject>(var)->GetTypeOfString(scriptContext);
            }
        }
        JIT_HELPER_END(Op_Typeof);
    }